

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s98ml_lex.c
# Opt level: O2

void yyensure_buffer_stack(yyscan_t yyscanner)

{
  long lVar1;
  long lVar2;
  void *pvVar3;
  undefined8 *puVar4;
  yyguts_t *yyg;
  yyscan_t in_RSI;
  
  if (*(void **)((long)yyscanner + 0x28) == (void *)0x0) {
    puVar4 = (undefined8 *)malloc(8);
    *(undefined8 **)((long)yyscanner + 0x28) = puVar4;
    if (puVar4 == (undefined8 *)0x0) {
LAB_00104a05:
      yy_fatal_error("out of dynamic memory in yyensure_buffer_stack()",in_RSI);
    }
    *puVar4 = 0;
    *(undefined8 *)((long)yyscanner + 0x20) = 1;
    *(undefined8 *)((long)yyscanner + 0x18) = 0;
  }
  else {
    lVar1 = *(long *)((long)yyscanner + 0x20);
    if (lVar1 - 1U <= *(ulong *)((long)yyscanner + 0x18)) {
      in_RSI = (yyscan_t)(lVar1 * 8 + 0x40);
      pvVar3 = realloc(*(void **)((long)yyscanner + 0x28),(size_t)in_RSI);
      *(void **)((long)yyscanner + 0x28) = pvVar3;
      if (pvVar3 == (void *)0x0) goto LAB_00104a05;
      lVar2 = *(long *)((long)yyscanner + 0x20);
      puVar4 = (undefined8 *)((long)pvVar3 + lVar2 * 8 + 0x30);
      *puVar4 = 0;
      puVar4[1] = 0;
      puVar4 = (undefined8 *)((long)pvVar3 + lVar2 * 8 + 0x20);
      *puVar4 = 0;
      puVar4[1] = 0;
      puVar4 = (undefined8 *)((long)pvVar3 + lVar2 * 8 + 0x10);
      *puVar4 = 0;
      puVar4[1] = 0;
      puVar4 = (undefined8 *)((long)pvVar3 + lVar2 * 8);
      *puVar4 = 0;
      puVar4[1] = 0;
      *(long *)((long)yyscanner + 0x20) = lVar1 + 8;
    }
  }
  return;
}

Assistant:

static void yyensure_buffer_stack (yyscan_t yyscanner)
{
	yy_size_t num_to_alloc;
    struct yyguts_t * yyg = (struct yyguts_t*)yyscanner;

	if (!yyg->yy_buffer_stack) {

		/* First allocation is just for 2 elements, since we don't know if this
		 * scanner will even need a stack. We use 2 instead of 1 to avoid an
		 * immediate realloc on the next call.
         */
      num_to_alloc = 1; /* After all that talk, this was set to 1 anyways... */
		yyg->yy_buffer_stack = (struct yy_buffer_state**)yyalloc
								(num_to_alloc * sizeof(struct yy_buffer_state*)
								, yyscanner);
		if ( ! yyg->yy_buffer_stack )
			YY_FATAL_ERROR( "out of dynamic memory in yyensure_buffer_stack()" );

		memset(yyg->yy_buffer_stack, 0, num_to_alloc * sizeof(struct yy_buffer_state*));

		yyg->yy_buffer_stack_max = num_to_alloc;
		yyg->yy_buffer_stack_top = 0;
		return;
	}

	if (yyg->yy_buffer_stack_top >= (yyg->yy_buffer_stack_max) - 1){

		/* Increase the buffer to prepare for a possible push. */
		yy_size_t grow_size = 8 /* arbitrary grow size */;

		num_to_alloc = yyg->yy_buffer_stack_max + grow_size;
		yyg->yy_buffer_stack = (struct yy_buffer_state**)yyrealloc
								(yyg->yy_buffer_stack,
								num_to_alloc * sizeof(struct yy_buffer_state*)
								, yyscanner);
		if ( ! yyg->yy_buffer_stack )
			YY_FATAL_ERROR( "out of dynamic memory in yyensure_buffer_stack()" );

		/* zero only the new slots.*/
		memset(yyg->yy_buffer_stack + yyg->yy_buffer_stack_max, 0, grow_size * sizeof(struct yy_buffer_state*));
		yyg->yy_buffer_stack_max = num_to_alloc;
	}
}